

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btMultiBodyDynamicsWorld::integrateTransforms(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  btMultiBody *this_00;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  btQuaternion *pbVar7;
  btVector3 *pbVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  btAlignedObjectArray<btVector3> local_origin;
  btAlignedObjectArray<btQuaternion> world_to_local;
  btAlignedObjectArray<btVector3> local_80;
  btAlignedObjectArray<btQuaternion> local_60;
  btScalar local_3c;
  btMultiBodyDynamicsWorld *local_38;
  
  local_3c = timeStep;
  btDiscreteDynamicsWorld::integrateTransforms(&this->super_btDiscreteDynamicsWorld,timeStep);
  CProfileManager::Start_Profile("btMultiBody stepPositions");
  local_60.m_ownsMemory = true;
  local_60.m_data = (btQuaternion *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  local_80.m_ownsMemory = true;
  local_80.m_data = (btVector3 *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  if (0 < (this->m_multiBodies).m_size) {
    lVar10 = 0;
    local_38 = this;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar10];
      if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar13 = false;
      }
      else {
        bVar13 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
      }
      iVar3 = (this_00->m_links).m_size;
      lVar12 = (long)iVar3;
      if (0 < lVar12) {
        lVar11 = 0;
        bVar6 = bVar13;
        do {
          lVar4 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar11 + 0x1c);
          if ((lVar4 != 0) && (bVar13 = bVar6, *(int *)(lVar4 + 0xec) == 2)) {
            bVar6 = true;
            bVar13 = true;
          }
          lVar11 = lVar11 + 600;
        } while (lVar12 * 600 - lVar11 != 0);
      }
      if (bVar13) {
        btMultiBody::clearVelocities(this_00);
      }
      else {
        if (this_00->__posUpdated == false) {
          btMultiBody::stepPositionsMultiDof(this_00,local_3c,(btScalar *)0x0,(btScalar *)0x0);
        }
        else {
          iVar9 = this_00->m_dofCount;
          btMultiBody::stepPositionsMultiDof
                    (this_00,1.0,(btScalar *)0x0,
                     (this_00->m_realBuf).m_data + (iVar9 + iVar9 * iVar9 + 6));
          this_00->__posUpdated = false;
        }
        lVar12 = lVar12 + 1;
        iVar9 = (int)lVar12;
        if (((local_60.m_size <= iVar9) && (local_60.m_size <= iVar3)) &&
           (local_60.m_capacity <= iVar3)) {
          if (iVar9 == 0) {
            pbVar7 = (btQuaternion *)0x0;
          }
          else {
            pbVar7 = (btQuaternion *)btAlignedAllocInternal(lVar12 * 0x10,0x10);
          }
          if (0 < (long)local_60.m_size) {
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)((long)((local_60.m_data)->super_btQuadWord).m_floats + lVar11)
              ;
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)(pbVar7->super_btQuadWord).m_floats + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar11 = lVar11 + 0x10;
            } while ((long)local_60.m_size * 0x10 != lVar11);
          }
          if ((local_60.m_data != (btQuaternion *)0x0) && (local_60.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_60.m_data);
          }
          local_60.m_ownsMemory = true;
          local_60._4_8_ = lVar12 << 0x20;
          this = local_38;
          local_60.m_data = pbVar7;
        }
        local_60.m_size = iVar9;
        if (((local_80.m_size <= iVar9) && (local_80.m_size <= iVar3)) &&
           (local_80.m_capacity <= iVar3)) {
          if (iVar9 == 0) {
            pbVar8 = (btVector3 *)0x0;
          }
          else {
            pbVar8 = (btVector3 *)btAlignedAllocInternal((long)iVar9 << 4,0x10);
          }
          if (0 < (long)local_80.m_size) {
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_80.m_data)->m_floats + lVar11);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar8->m_floats + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              lVar11 = lVar11 + 0x10;
            } while ((long)local_80.m_size * 0x10 != lVar11);
          }
          if ((local_80.m_data != (btVector3 *)0x0) && (local_80.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_80.m_data);
          }
          local_80.m_ownsMemory = true;
          local_80._4_8_ = lVar12 << 0x20;
          this = local_38;
          local_80.m_data = pbVar8;
        }
        local_80.m_size = iVar9;
        btMultiBody::updateCollisionObjectWorldTransforms(this_00,&local_60,&local_80);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_multiBodies).m_size);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_80);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_60);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btDiscreteDynamicsWorld::integrateTransforms(timeStep);

	{
		BT_PROFILE("btMultiBody stepPositions");
		//integrate and update the Featherstone hierarchies
		btAlignedObjectArray<btQuaternion> world_to_local;
		btAlignedObjectArray<btVector3> local_origin;

		for (int b=0;b<m_multiBodies.size();b++)
		{
			btMultiBody* bod = m_multiBodies[b];
			bool isSleeping = false;
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			}


			if (!isSleeping)
			{
				int nLinks = bod->getNumLinks();

				///base + num m_links
			
				
				{
					if(!bod->isPosUpdated())
						bod->stepPositionsMultiDof(timeStep);
					else
					{
						btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
						pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

						bod->stepPositionsMultiDof(1, 0, pRealBuf);
						bod->setPosUpdated(false);
					}
				}
				
				world_to_local.resize(nLinks+1);
				local_origin.resize(nLinks+1);

				bod->updateCollisionObjectWorldTransforms(world_to_local,local_origin);
				
			} else
			{
				bod->clearVelocities();
			}
		}
	}
}